

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffuptf(fitsfile *fptr,int *status)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  int *in_RSI;
  char *tmp;
  char message [81];
  char card [81];
  char lenval [40];
  char newform [71];
  char tform [71];
  char keyname [75];
  char comment [73];
  LONGLONG jj;
  LONGLONG naxis2;
  LONGLONG maxlen;
  LONGLONG addr;
  LONGLONG length;
  long tflds;
  int lenform;
  int ii;
  undefined8 in_stack_fffffffffffffd68;
  fitsfile *in_stack_fffffffffffffd70;
  char local_288 [24];
  int *in_stack_fffffffffffffd90;
  LONGLONG *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  int *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  fitsfile *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  fitsfile *in_stack_fffffffffffffdc8;
  int *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  fitsfile *in_stack_fffffffffffffdf0;
  char local_1c8 [48];
  int *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  char local_148;
  char local_147;
  long local_50;
  long local_48;
  long local_40;
  long local_30;
  long local_28;
  int local_20;
  int local_1c;
  int *local_18;
  
  local_20 = 0;
  local_18 = in_RSI;
  ffmaky(in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20),(int *)0x17f91c);
  ffgkyjj(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,(LONGLONG *)in_stack_fffffffffffffdb8,
          (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
          in_stack_fffffffffffffda8);
  ffgkyj(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,(long *)in_stack_fffffffffffffdb8,
         (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
         in_stack_fffffffffffffda8);
  local_1c = 1;
  while( true ) {
    if (local_28 < local_1c) {
      return *local_18;
    }
    ffkeyn((char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
           (char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    iVar1 = ffgkys(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                   (char *)in_stack_fffffffffffffdb8,
                   (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   in_stack_fffffffffffffda8);
    if (0 < iVar1) break;
    if ((((local_148 == 'P') || (local_147 == 'P')) || (local_148 == 'Q')) || (local_147 == 'Q')) {
      local_40 = 0;
      for (local_50 = 1; local_50 <= local_48; local_50 = local_50 + 1) {
        ffgdesll(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,
                 (LONGLONG)in_stack_fffffffffffffda8,
                 (LONGLONG *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        if (local_40 < local_30) {
          local_40 = local_30;
        }
      }
      strcpy(&stack0xfffffffffffffe68,"\'");
      pcVar2 = strchr(&local_148,0x28);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      sVar3 = strlen(&local_148);
      local_20 = (int)sVar3;
      snprintf(local_1c8,0x28,"(%.0f)",(double)local_40);
      lVar4 = (long)local_20;
      sVar3 = strlen(local_1c8);
      if (0x46 < lVar4 + sVar3 + 2) {
        ffpmsg((char *)0x17fb9f);
        *local_18 = 0x105;
        return 0x105;
      }
      strcat(&stack0xfffffffffffffe68,&local_148);
      strcat(&stack0xfffffffffffffe68,local_1c8);
      while (sVar3 = strlen(&stack0xfffffffffffffe68), sVar3 < 9) {
        strcat(&stack0xfffffffffffffe68," ");
      }
      strcat(&stack0xfffffffffffffe68,"\'");
      ffmkky(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      ffmkey(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    }
    local_1c = local_1c + 1;
  }
  snprintf(local_288,0x51,"Error while updating variable length vector TFORMn values (ffuptf).");
  ffpmsg((char *)0x17fa0c);
  return *local_18;
}

Assistant:

int ffuptf(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  Update the value of the TFORM keywords for the variable length array
  columns to make sure they all have the form 1Px(len) or Px(len) where
  'len' is the maximum length of the vector in the table (e.g., '1PE(400)')
*/
{
    int ii, lenform=0;
    long tflds;
    LONGLONG length, addr, maxlen, naxis2, jj;
    char comment[FLEN_COMMENT], keyname[FLEN_KEYWORD];
    char tform[FLEN_VALUE], newform[FLEN_VALUE], lenval[40];
    char card[FLEN_CARD];
    char message[FLEN_ERRMSG];
    char *tmp;

    ffmaky(fptr, 2, status);         /* reset to beginning of header */
    ffgkyjj(fptr, "NAXIS2", &naxis2, comment, status);
    ffgkyj(fptr, "TFIELDS", &tflds, comment, status);

    for (ii = 1; ii <= tflds; ii++)        /* loop over all the columns */
    {
      ffkeyn("TFORM", ii, keyname, status);          /* construct name */
      if (ffgkys(fptr, keyname, tform, comment, status) > 0)
      {
        snprintf(message,FLEN_ERRMSG,
        "Error while updating variable length vector TFORMn values (ffuptf).");
        ffpmsg(message);
        return(*status);
      }
      /* is this a variable array length column ? */
      if (tform[0] == 'P' || tform[1] == 'P' || tform[0] == 'Q' || tform[1] == 'Q')
      {
          /* get the max length */
          maxlen = 0;
          for (jj=1; jj <= naxis2; jj++)
          {
            ffgdesll(fptr, ii, jj, &length, &addr, status);

	    if (length > maxlen)
	         maxlen = length;
          }

          /* construct the new keyword value */
          strcpy(newform, "'");
          tmp = strchr(tform, '(');  /* truncate old length, if present */
          if (tmp) *tmp = 0;
          lenform = strlen(tform);

          /* print as double, because the string-to-64-bit */
          /* conversion is platform dependent (%lld, %ld, %I64d) */

          snprintf(lenval,40, "(%.0f)", (double) maxlen);
          
          if (lenform+strlen(lenval)+2 > FLEN_VALUE-1)
          {
             ffpmsg("Error assembling TFORMn string (ffuptf).");
             return(*status = BAD_TFORM);
          }
          strcat(newform, tform);

          strcat(newform,lenval);
          while(strlen(newform) < 9)
             strcat(newform," ");   /* append spaces 'till length = 8 */
          strcat(newform,"'" );     /* append closing parenthesis */
          /* would be simpler to just call ffmkyj here, but this */
          /* would force linking in all the modkey & putkey routines */
          ffmkky(keyname, newform, comment, card, status);  /* make new card */
          ffmkey(fptr, card, status);   /* replace last read keyword */
      }
    }
    return(*status);
}